

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O0

void project_feature_handler_KILL_TRAP(project_feature_handler_context_t *context)

{
  loc_conflict grid_00;
  _Bool _Var1;
  loc_conflict grid;
  project_feature_handler_context_t *context_local;
  
  grid_00 = context->grid;
  _Var1 = square_issecretdoor((chunk *)cave,grid_00);
  if (_Var1) {
    place_closed_door(cave,(loc)grid_00);
    _Var1 = square_isseen((chunk *)cave,grid_00);
    if (_Var1) {
      context->obvious = true;
    }
  }
  _Var1 = square_isdisarmabletrap((chunk *)cave,grid_00);
  if (_Var1) {
    _Var1 = square_isseen((chunk *)cave,grid_00);
    if (_Var1) {
      msg("The trap seizes up.");
      context->obvious = true;
    }
    square_disable_trap((chunk *)cave,grid_00);
  }
  else {
    _Var1 = square_islockeddoor((chunk *)cave,grid_00);
    if (_Var1) {
      square_unlock_door((chunk *)cave,grid_00);
      _Var1 = square_isview((chunk *)cave,grid_00);
      if (_Var1) {
        msg("Click!");
        context->obvious = true;
      }
    }
  }
  return;
}

Assistant:

static void project_feature_handler_KILL_TRAP(project_feature_handler_context_t *context)
{
	const struct loc grid = context->grid;

	/* Reveal secret doors */
	if (square_issecretdoor(cave, grid)) {
		place_closed_door(cave, grid);

		/* Check if visible */
		if (square_isseen(cave, grid))
			context->obvious = true;
	}

	/* Disable traps, unlock doors */
	if (square_isdisarmabletrap(cave, grid)) {
		/* Check if visible */
		if (square_isseen(cave, grid)) {
			msg("The trap seizes up.");
			context->obvious = true;
		}

		/* Disable the trap */
		square_disable_trap(cave, grid);
	} else if (square_islockeddoor(cave, grid)) {
		/* Unlock the door */
		square_unlock_door(cave, grid);

		/* Check line of sound; approximated with square_isview() */
		if (square_isview(cave, grid)) {
			msg("Click!");
			context->obvious = true;
		}
	}
}